

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpabortdescriptors.cpp
# Opt level: O2

int __thiscall jrtplib::RTPAbortDescriptors::Init(RTPAbortDescriptors *this)

{
  int iVar1;
  
  iVar1 = -0xad;
  if (this->m_init == false) {
    iVar1 = pipe(this->m_descriptors);
    if (iVar1 < 0) {
      iVar1 = -0xb0;
    }
    else {
      this->m_init = true;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int RTPAbortDescriptors::Init()
{
	if (m_init)
		return ERR_RTP_ABORTDESC_ALREADYINIT;

	if (pipe(m_descriptors) < 0)
		return ERR_RTP_ABORTDESC_CANTCREATEPIPE;

	m_init = true;
	return 0;
}